

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O3

int mbedtls_chachapoly_update(mbedtls_chachapoly_context *ctx,size_t len,uchar *input,uchar *output)

{
  uint uVar1;
  int iVar2;
  uchar zeroes [15];
  uchar local_30 [16];
  
  iVar2 = -0x54;
  if (ctx->state - 1U < 2) {
    if (ctx->state == 1) {
      ctx->state = 2;
      uVar1 = (uint)ctx->aad_len & 0xf;
      if (uVar1 != 0) {
        local_30[8] = '\0';
        local_30[9] = '\0';
        local_30[10] = '\0';
        local_30[0xb] = '\0';
        local_30[0xc] = '\0';
        local_30[0xd] = '\0';
        local_30[0xe] = '\0';
        local_30[0] = '\0';
        local_30[1] = '\0';
        local_30[2] = '\0';
        local_30[3] = '\0';
        local_30[4] = '\0';
        local_30[5] = '\0';
        local_30[6] = '\0';
        local_30[7] = 0;
        iVar2 = mbedtls_poly1305_update(&ctx->poly1305_ctx,local_30,(ulong)(0x10 - uVar1));
        if (iVar2 != 0) {
          return iVar2;
        }
      }
    }
    ctx->ciphertext_len = ctx->ciphertext_len + len;
    if (ctx->mode == MBEDTLS_CHACHAPOLY_ENCRYPT) {
      iVar2 = mbedtls_chacha20_update(&ctx->chacha20_ctx,len,input,output);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = mbedtls_poly1305_update(&ctx->poly1305_ctx,output,len);
    }
    else {
      iVar2 = mbedtls_poly1305_update(&ctx->poly1305_ctx,input,len);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = mbedtls_chacha20_update(&ctx->chacha20_ctx,len,input,output);
    }
    if (iVar2 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_chachapoly_update( mbedtls_chachapoly_context *ctx,
                               size_t len,
                               const unsigned char *input,
                               unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( len == 0 || input != NULL );
    CHACHAPOLY_VALIDATE_RET( len == 0 || output != NULL );

    if( ( ctx->state != CHACHAPOLY_STATE_AAD ) &&
        ( ctx->state != CHACHAPOLY_STATE_CIPHERTEXT ) )
    {
        return( MBEDTLS_ERR_CHACHAPOLY_BAD_STATE );
    }

    if( ctx->state == CHACHAPOLY_STATE_AAD )
    {
        ctx->state = CHACHAPOLY_STATE_CIPHERTEXT;

        ret = chachapoly_pad_aad( ctx );
        if( ret != 0 )
            return( ret );
    }

    ctx->ciphertext_len += len;

    if( ctx->mode == MBEDTLS_CHACHAPOLY_ENCRYPT )
    {
        ret = mbedtls_chacha20_update( &ctx->chacha20_ctx, len, input, output );
        if( ret != 0 )
            return( ret );

        ret = mbedtls_poly1305_update( &ctx->poly1305_ctx, output, len );
        if( ret != 0 )
            return( ret );
    }
    else /* DECRYPT */
    {
        ret = mbedtls_poly1305_update( &ctx->poly1305_ctx, input, len );
        if( ret != 0 )
            return( ret );

        ret = mbedtls_chacha20_update( &ctx->chacha20_ctx, len, input, output );
        if( ret != 0 )
            return( ret );
    }

    return( 0 );
}